

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrTsim.c
# Opt level: O2

Pdr_Set_t * Pdr_ManTernarySim(Pdr_Man_t *p,int k,Pdr_Set_t *pCube)

{
  Vec_Int_t *p_00;
  Vec_Int_t *vPiLits;
  Vec_Int_t *vCiObjs;
  Pdr_Man_t *p_01;
  Vec_Int_t *vValues;
  Vec_Int_t *vValues_00;
  Vec_Int_t *vNodes;
  Vec_Int_t *vUndo;
  Vec_Int_t *vVis;
  Vec_Int_t *p_02;
  Vec_Int_t *vRes;
  Aig_Man_t *pAVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  void *pvVar6;
  Aig_Obj_t *pAVar7;
  ulong uVar8;
  Pdr_Set_t *pPVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  Pdr_Man_t *pPVar15;
  FILE *pFVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  
  p_00 = p->vPrio;
  vPiLits = p->vLits;
  vCiObjs = p->vCiObjs;
  p_01 = (Pdr_Man_t *)p->vCoObjs;
  vValues = p->vCiVals;
  vValues_00 = p->vCoVals;
  vNodes = p->vNodes;
  vUndo = p->vUndo;
  vVis = p->vVisits;
  p_02 = p->vCi2Rem;
  vRes = p->vRes;
  *(int *)((long)&p_01->pPars + 4) = 0;
  if (pCube == (Pdr_Set_t *)0x0) {
    pvVar6 = Vec_PtrEntry(p->pAig->vCos,p->iOutCur);
    pPVar15 = p_01;
    Vec_IntPush((Vec_Int_t *)p_01,*(int *)((long)pvVar6 + 0x24));
    iVar3 = (int)pPVar15;
  }
  else {
    pPVar15 = p;
    for (lVar13 = 0; iVar3 = (int)pPVar15, lVar13 < pCube->nLits; lVar13 = lVar13 + 1) {
      if (*(int *)(&pCube->field_0x14 + lVar13 * 4) != -1) {
        pvVar6 = Vec_PtrEntry(p->pAig->vCos,
                              (*(int *)(&pCube->field_0x14 + lVar13 * 4) >> 1) + p->pAig->nTruePos);
        pPVar15 = p_01;
        Vec_IntPush((Vec_Int_t *)p_01,*(int *)((long)pvVar6 + 0x24));
      }
    }
  }
  if (p->pPars->fVeryVerbose != 0) {
    Abc_Print(iVar3,"Trying to justify cube ");
    if (pCube == (Pdr_Set_t *)0x0) {
      Abc_Print(iVar3,"<prop=fail>");
    }
    else {
      pFVar16 = _stdout;
      Pdr_SetPrint(_stdout,pCube,p->pAig->nRegs,(Vec_Int_t *)0x0);
      iVar3 = (int)pFVar16;
    }
    Abc_Print(iVar3," in frame %d.\n",k);
  }
  Pdr_ManCollectCone(p->pAig,(Vec_Int_t *)p_01,vCiObjs,vNodes);
  Pdr_ManCollectValues(p,k,vCiObjs,vValues);
  Pdr_ManCollectValues(p,k,(Vec_Int_t *)p_01,vValues_00);
  if (p->pPars->fVeryVerbose != 0) {
    Pdr_ManPrintCex(p->pAig,vCiObjs,vValues,(Vec_Int_t *)0x0);
  }
  iVar3 = Pdr_ManSimDataInit(p->pAig,vCiObjs,vValues,vNodes,(Vec_Int_t *)p_01,vValues_00,
                             (Vec_Int_t *)0x0);
  if (iVar3 == 0) {
    __assert_fail("RetValue",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrTsim.c"
                  ,0x195,"Pdr_Set_t *Pdr_ManTernarySim(Pdr_Man_t *, int, Pdr_Set_t *)");
  }
  if (p->pPars->fFlopPrio == 0) {
    p_02->nSize = 0;
    for (iVar3 = 0; iVar4 = vCiObjs->nSize, iVar3 < iVar4; iVar3 = iVar3 + 1) {
      pAVar1 = p->pAig;
      iVar4 = Vec_IntEntry(vCiObjs,iVar3);
      pAVar7 = Aig_ManObj(pAVar1,iVar4);
      iVar4 = Saig_ObjIsLo(p->pAig,pAVar7);
      if (iVar4 != 0) {
        iVar4 = Aig_ObjCioId(pAVar7);
        iVar4 = Vec_IntEntry(p_00,iVar4 - p->pAig->nTruePis);
        if (iVar4 == 0) {
          vUndo->nSize = 0;
          iVar4 = Pdr_ManExtendOne(p->pAig,pAVar7,vUndo,vVis);
          if (iVar4 == 0) {
            Pdr_ManExtendUndo(p->pAig,vUndo);
          }
          else {
            Vec_IntPush(p_02,pAVar7->Id);
          }
        }
      }
    }
    for (iVar3 = 0; iVar3 < iVar4; iVar3 = iVar3 + 1) {
      pAVar1 = p->pAig;
      iVar4 = Vec_IntEntry(vCiObjs,iVar3);
      pAVar7 = Aig_ManObj(pAVar1,iVar4);
      iVar4 = Saig_ObjIsLo(p->pAig,pAVar7);
      if (iVar4 != 0) {
        iVar4 = Aig_ObjCioId(pAVar7);
        iVar4 = Vec_IntEntry(p_00,iVar4 - p->pAig->nTruePis);
        if (iVar4 != 0) {
          vUndo->nSize = 0;
          iVar4 = Pdr_ManExtendOne(p->pAig,pAVar7,vUndo,vVis);
          if (iVar4 == 0) {
            Pdr_ManExtendUndo(p->pAig,vUndo);
          }
          else {
            Vec_IntPush(p_02,pAVar7->Id);
          }
        }
      }
      iVar4 = vCiObjs->nSize;
    }
  }
  else {
    vRes->nSize = 0;
    for (iVar3 = 0; iVar3 < vCiObjs->nSize; iVar3 = iVar3 + 1) {
      pAVar1 = p->pAig;
      iVar4 = Vec_IntEntry(vCiObjs,iVar3);
      pAVar7 = Aig_ManObj(pAVar1,iVar4);
      iVar4 = Saig_ObjIsLo(p->pAig,pAVar7);
      if (iVar4 != 0) {
        iVar4 = Aig_ObjCioId(pAVar7);
        Vec_IntPush(vRes,iVar4 - p->pAig->nTruePis);
      }
    }
    uVar5 = vRes->nSize;
    uVar10 = 1;
    if (1 < (int)uVar5) {
      uVar10 = uVar5;
    }
    piVar2 = vRes->pArray;
    uVar8 = 1;
    for (uVar12 = 0; uVar12 != uVar10 - 1; uVar12 = uVar12 + 1) {
      uVar18 = uVar12 & 0xffffffff;
      uVar19 = uVar8;
      while( true ) {
        uVar17 = (uint)uVar18;
        if (uVar5 == uVar19) break;
        iVar3 = Vec_IntEntry(p_00,piVar2[uVar19]);
        iVar4 = Vec_IntEntry(p_00,piVar2[(int)uVar17]);
        uVar11 = (uint)uVar19;
        if (iVar4 <= iVar3) {
          uVar11 = uVar17;
        }
        uVar19 = uVar19 + 1;
        uVar18 = (ulong)uVar11;
      }
      iVar3 = piVar2[uVar12];
      piVar2[uVar12] = piVar2[(int)uVar17];
      piVar2[(int)uVar17] = iVar3;
      uVar8 = uVar8 + 1;
    }
    p_02->nSize = 0;
    for (iVar3 = 0; iVar3 < vRes->nSize; iVar3 = iVar3 + 1) {
      iVar4 = Vec_IntEntry(vRes,iVar3);
      pAVar7 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vCis,iVar4 + p->pAig->nTruePis);
      iVar4 = Saig_ObjIsLo(p->pAig,pAVar7);
      if (iVar4 == 0) {
        __assert_fail("Saig_ObjIsLo( p->pAig, pObj )",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrTsim.c"
                      ,0x1aa,"Pdr_Set_t *Pdr_ManTernarySim(Pdr_Man_t *, int, Pdr_Set_t *)");
      }
      vUndo->nSize = 0;
      iVar4 = Pdr_ManExtendOne(p->pAig,pAVar7,vUndo,vVis);
      if (iVar4 == 0) {
        Pdr_ManExtendUndo(p->pAig,vUndo);
      }
      else {
        Vec_IntPush(p_02,pAVar7->Id);
      }
    }
  }
  if (p->pPars->fVeryVerbose != 0) {
    Pdr_ManPrintCex(p->pAig,vCiObjs,vValues,p_02);
  }
  iVar3 = Pdr_ManSimDataInit(p->pAig,vCiObjs,vValues,vNodes,(Vec_Int_t *)p_01,vValues_00,p_02);
  if (iVar3 != 0) {
    Pdr_ManDeriveResult(p->pAig,vCiObjs,vValues,p_02,vRes,vPiLits);
    iVar3 = vRes->nSize;
    if (iVar3 < 1) {
      __assert_fail("Vec_IntSize(vRes) > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrTsim.c"
                    ,0x1da,"Pdr_Set_t *Pdr_ManTernarySim(Pdr_Man_t *, int, Pdr_Set_t *)");
    }
    if ((p->pPars->fUseAbs != 0) && (p->vAbsFlops != (Vec_Int_t *)0x0)) {
      uVar12 = 0;
      for (iVar4 = 0; iVar14 = (int)uVar12, iVar4 < iVar3; iVar4 = iVar4 + 1) {
        uVar5 = Vec_IntEntry(vRes,iVar4);
        if ((int)uVar5 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x12f,"int Abc_Lit2Var(int)");
        }
        iVar3 = Vec_IntEntry(p->vAbsFlops,uVar5 >> 1);
        if (iVar3 == 0) {
          Vec_IntPush(vPiLits,uVar5 + p->pAig->nTruePis * 2);
        }
        else {
          if ((iVar14 < 0) || (vRes->nSize <= iVar14)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          vRes->pArray[uVar12] = uVar5;
          uVar12 = (ulong)(iVar14 + 1);
        }
        iVar3 = vRes->nSize;
      }
      if (iVar3 < iVar14) {
        __assert_fail("p->nSize >= nSizeNew",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
      }
      vRes->nSize = iVar14;
    }
    pPVar9 = Pdr_SetCreate(vRes,vPiLits);
    return pPVar9;
  }
  __assert_fail("RetValue",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrTsim.c"
                ,0x1d6,"Pdr_Set_t *Pdr_ManTernarySim(Pdr_Man_t *, int, Pdr_Set_t *)");
}

Assistant:

Pdr_Set_t * Pdr_ManTernarySim( Pdr_Man_t * p, int k, Pdr_Set_t * pCube )
{
    Pdr_Set_t * pRes;
    Vec_Int_t * vPrio   = p->vPrio;    // priority flops (flop indices)
    Vec_Int_t * vPiLits = p->vLits;    // array of literals (0/1 PI values)
    Vec_Int_t * vCiObjs = p->vCiObjs;  // cone leaves (CI obj IDs)
    Vec_Int_t * vCoObjs = p->vCoObjs;  // cone roots (CO obj IDs)
    Vec_Int_t * vCiVals = p->vCiVals;  // cone leaf values (0/1 CI values)
    Vec_Int_t * vCoVals = p->vCoVals;  // cone root values (0/1 CO values)
    Vec_Int_t * vNodes  = p->vNodes;   // cone nodes (node obj IDs)
    Vec_Int_t * vUndo   = p->vUndo;    // cone undos (node obj IDs)
    Vec_Int_t * vVisits = p->vVisits;  // intermediate (obj IDs)
    Vec_Int_t * vCi2Rem = p->vCi2Rem;  // CIs to be removed (CI obj IDs)
    Vec_Int_t * vRes    = p->vRes;     // final result (flop literals)
    Aig_Obj_t * pObj;
    int i, Entry, RetValue;
    //abctime clk = Abc_Clock();

    // collect CO objects
    Vec_IntClear( vCoObjs );
    if ( pCube == NULL ) // the target is the property output
    {
//        Vec_IntPush( vCoObjs, Aig_ObjId(Aig_ManCo(p->pAig, (p->pPars->iOutput==-1)?0:p->pPars->iOutput)) );
        Vec_IntPush( vCoObjs, Aig_ObjId(Aig_ManCo(p->pAig, p->iOutCur)) );
    }
    else // the target is the cube
    {
        for ( i = 0; i < pCube->nLits; i++ )
        {
            if ( pCube->Lits[i] == -1 )
                continue;
            pObj = Saig_ManLi(p->pAig, (pCube->Lits[i] >> 1));
            Vec_IntPush( vCoObjs, Aig_ObjId(pObj) );
        }
    }
if ( p->pPars->fVeryVerbose )
{
Abc_Print( 1, "Trying to justify cube " );
if ( pCube )
    Pdr_SetPrint( stdout, pCube, Aig_ManRegNum(p->pAig), NULL );
else
    Abc_Print( 1, "<prop=fail>" );
Abc_Print( 1, " in frame %d.\n", k );
}

    // collect CI objects
    Pdr_ManCollectCone( p->pAig, vCoObjs, vCiObjs, vNodes );
    // collect values
    Pdr_ManCollectValues( p, k, vCiObjs, vCiVals );
    Pdr_ManCollectValues( p, k, vCoObjs, vCoVals );
    // simulate for the first time
if ( p->pPars->fVeryVerbose )
Pdr_ManPrintCex( p->pAig, vCiObjs, vCiVals, NULL );
    RetValue = Pdr_ManSimDataInit( p->pAig, vCiObjs, vCiVals, vNodes, vCoObjs, vCoVals, NULL );
    assert( RetValue );

    // iteratively remove flops
    if ( p->pPars->fFlopPrio )
    {
        // collect flops and sort them by priority
        Vec_IntClear( vRes );
        Aig_ManForEachObjVec( vCiObjs, p->pAig, pObj, i )
        {
            if ( !Saig_ObjIsLo( p->pAig, pObj ) )
                continue;
            Entry = Aig_ObjCioId(pObj) - Saig_ManPiNum(p->pAig);
            Vec_IntPush( vRes, Entry );
        }
        Vec_IntSelectSortCost( Vec_IntArray(vRes), Vec_IntSize(vRes), vPrio );

        // try removing flops starting from low-priority to high-priority
        Vec_IntClear( vCi2Rem );
        Vec_IntForEachEntry( vRes, Entry, i )
        {
            pObj = Aig_ManCi( p->pAig, Saig_ManPiNum(p->pAig) + Entry );
            assert( Saig_ObjIsLo( p->pAig, pObj ) );
            Vec_IntClear( vUndo );
            if ( Pdr_ManExtendOne( p->pAig, pObj, vUndo, vVisits ) )
                Vec_IntPush( vCi2Rem, Aig_ObjId(pObj) );
            else
                Pdr_ManExtendUndo( p->pAig, vUndo );
        }
    }
    else
    {
        // try removing low-priority flops first
        Vec_IntClear( vCi2Rem );
        Aig_ManForEachObjVec( vCiObjs, p->pAig, pObj, i )
        {
            if ( !Saig_ObjIsLo( p->pAig, pObj ) )
                continue;
            Entry = Aig_ObjCioId(pObj) - Saig_ManPiNum(p->pAig);
            if ( Vec_IntEntry(vPrio, Entry) )
                continue;
            Vec_IntClear( vUndo );
            if ( Pdr_ManExtendOne( p->pAig, pObj, vUndo, vVisits ) )
                Vec_IntPush( vCi2Rem, Aig_ObjId(pObj) );
            else
                Pdr_ManExtendUndo( p->pAig, vUndo );
        }
        // try removing high-priority flops next
        Aig_ManForEachObjVec( vCiObjs, p->pAig, pObj, i )
        {
            if ( !Saig_ObjIsLo( p->pAig, pObj ) )
                continue;
            Entry = Aig_ObjCioId(pObj) - Saig_ManPiNum(p->pAig);
            if ( !Vec_IntEntry(vPrio, Entry) )
                continue;
            Vec_IntClear( vUndo );
            if ( Pdr_ManExtendOne( p->pAig, pObj, vUndo, vVisits ) )
                Vec_IntPush( vCi2Rem, Aig_ObjId(pObj) );
            else
                Pdr_ManExtendUndo( p->pAig, vUndo );
        }
    }

if ( p->pPars->fVeryVerbose )
Pdr_ManPrintCex( p->pAig, vCiObjs, vCiVals, vCi2Rem );
    RetValue = Pdr_ManSimDataInit( p->pAig, vCiObjs, vCiVals, vNodes, vCoObjs, vCoVals, vCi2Rem );
    assert( RetValue );

    // derive the set of resulting registers
    Pdr_ManDeriveResult( p->pAig, vCiObjs, vCiVals, vCi2Rem, vRes, vPiLits );
    assert( Vec_IntSize(vRes) > 0 );
    //p->tTsim += Abc_Clock() - clk;

    // move abstracted literals from flops to inputs
    if ( p->pPars->fUseAbs && p->vAbsFlops )
    {
        int i, iLit, k = 0;
        Vec_IntForEachEntry( vRes, iLit, i )
        {
            if ( Vec_IntEntry(p->vAbsFlops, Abc_Lit2Var(iLit)) ) // used flop
                Vec_IntWriteEntry( vRes, k++, iLit );
            else
                Vec_IntPush( vPiLits, 2*Saig_ManPiNum(p->pAig) + iLit );
        }
        Vec_IntShrink( vRes, k );
    }
    pRes = Pdr_SetCreate( vRes, vPiLits );
    //ZH: Disabled assertion because this invariant doesn't hold with down
    //because of the join operation which can bring in initial states
    //assert( k == 0 || !Pdr_SetIsInit(pRes, -1) );
    return pRes;
}